

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::anon_unknown_0::JavaGeneratorTest::JavaGeneratorTest
          (JavaGeneratorTest *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  JavaGenerator *this_00;
  Metadata MVar2;
  string_view name;
  string_view name_00;
  string_view contents;
  string_view contents_00;
  _Head_base<0UL,_google::protobuf::compiler::CodeGenerator_*,_false> local_90;
  string local_88;
  string local_68;
  string local_48;
  
  CommandLineInterfaceTester::CommandLineInterfaceTester(&this->super_CommandLineInterfaceTester);
  (this->super_CommandLineInterfaceTester).super_Test._vptr_Test =
       (_func_int **)&PTR__CommandLineInterfaceTester_018d7158;
  paVar1 = &local_88.field_2;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"--java_out","");
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"--java_opt","");
  this_00 = (JavaGenerator *)operator_new(0x10);
  JavaGenerator::JavaGenerator(this_00);
  local_90._M_head_impl = (CodeGenerator *)this_00;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Java test generator","");
  std::
  vector<std::unique_ptr<google::protobuf::compiler::CodeGenerator,std::default_delete<google::protobuf::compiler::CodeGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::CodeGenerator,std::default_delete<google::protobuf::compiler::CodeGenerator>>>>
  ::
  emplace_back<std::unique_ptr<google::protobuf::compiler::CodeGenerator,std::default_delete<google::protobuf::compiler::CodeGenerator>>>
            ((vector<std::unique_ptr<google::protobuf::compiler::CodeGenerator,std::default_delete<google::protobuf::compiler::CodeGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::CodeGenerator,std::default_delete<google::protobuf::compiler::CodeGenerator>>>>
              *)&(this->super_CommandLineInterfaceTester).generators_,
             (unique_ptr<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>
              *)&local_90);
  CommandLineInterface::RegisterGenerator
            (&(this->super_CommandLineInterfaceTester).cli_,&local_88,&local_48,
             (this->super_CommandLineInterfaceTester).generators_.
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::compiler::CodeGenerator_*,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>
             .super__Head_base<0UL,_google::protobuf::compiler::CodeGenerator_*,_false>._M_head_impl
             ,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((JavaGenerator *)local_90._M_head_impl != (JavaGenerator *)0x0) {
    (*((CodeGenerator *)&(local_90._M_head_impl)->_vptr_CodeGenerator)->_vptr_CodeGenerator[1])();
  }
  local_90._M_head_impl = (CodeGenerator *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  MVar2 = DescriptorProto::GetMetadata((DescriptorProto *)_DescriptorProto_default_instance_);
  FileDescriptor::DebugString_abi_cxx11_(&local_88,(MVar2.descriptor)->file_);
  name._M_str = "google/protobuf/descriptor.proto";
  name._M_len = 0x20;
  contents._M_str = local_88._M_dataplus._M_p;
  contents._M_len = local_88._M_string_length;
  CommandLineInterfaceTester::CreateTempFile(&this->super_CommandLineInterfaceTester,name,contents);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  MVar2 = pb::JavaFeatures::GetMetadata((JavaFeatures *)pb::_JavaFeatures_default_instance_);
  FileDescriptor::DebugString_abi_cxx11_(&local_88,(MVar2.descriptor)->file_);
  name_00._M_str = "third_party/java/protobuf/java_features.proto";
  name_00._M_len = 0x2d;
  contents_00._M_str = local_88._M_dataplus._M_p;
  contents_00._M_len = local_88._M_string_length;
  CommandLineInterfaceTester::CreateTempFile
            (&this->super_CommandLineInterfaceTester,name_00,contents_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

JavaGeneratorTest() {
    RegisterGenerator("--java_out", "--java_opt",
                      std::make_unique<JavaGenerator>(), "Java test generator");

    // Generate built-in protos.
    CreateTempFile(
        "google/protobuf/descriptor.proto",
        google::protobuf::DescriptorProto::descriptor()->file()->DebugString());
    CreateTempFile("third_party/java/protobuf/java_features.proto",
                   pb::JavaFeatures::descriptor()->file()->DebugString());
  }